

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void PeleLM::init_mixture_fraction(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  double *pdVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  int k;
  int i_5;
  Real mwt [21];
  int ecompCHON [84];
  Real atwCHON [4];
  int i_4;
  int i_3;
  Vector<double,_std::allocator<double>_> compositionIn_2;
  int entryCount_2;
  Real XO [21];
  Real XF [21];
  int i_2;
  int i_1;
  Vector<double,_std::allocator<double>_> compositionIn_1;
  int entryCount_1;
  string MFCompoType_1;
  int entryCount;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compositionIn;
  string MFCompoType;
  int hasUserMF;
  string MFformat;
  ParmParse pp;
  eos_type eos;
  int i;
  Real YO [21];
  Real YF [21];
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  specNames;
  Real XWinv;
  Real XW;
  Real XWinv_1;
  Real XW_1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff5c8;
  Print *in_stack_fffffffffffff5d0;
  string *in_stack_fffffffffffff5d8;
  ParmParse *in_stack_fffffffffffff5e0;
  size_type in_stack_fffffffffffff5e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff5f0;
  ostream *in_stack_fffffffffffff5f8;
  Print *in_stack_fffffffffffff600;
  double dVar9;
  double local_9f0;
  int in_stack_fffffffffffff630;
  int in_stack_fffffffffffff634;
  undefined8 in_stack_fffffffffffff638;
  undefined1 *puVar10;
  undefined4 in_stack_fffffffffffff640;
  int in_stack_fffffffffffff644;
  char *in_stack_fffffffffffff648;
  string *psVar11;
  undefined4 in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff654;
  char *in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  allocator *name;
  undefined4 in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  int local_980;
  int local_97c;
  double local_978 [11];
  char *in_stack_fffffffffffff6e0;
  ParmParse *in_stack_fffffffffffff6e8;
  int local_8c8 [38];
  int *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7f4;
  char *in_stack_fffffffffffff7f8;
  char *in_stack_fffffffffffff800;
  Real *in_stack_fffffffffffff808;
  string *in_stack_fffffffffffff810;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff818;
  double local_778 [54];
  int local_5c4;
  int local_5c0;
  int local_59c;
  double local_598 [4];
  double local_578;
  double local_570;
  double local_568;
  double local_560;
  double local_558;
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  double local_520;
  double local_518;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double local_4e8 [4];
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  double local_460;
  double local_458;
  double local_450;
  double local_448;
  int local_434;
  int local_430;
  undefined1 local_429 [29];
  int local_40c;
  string local_408 [32];
  string local_3e8 [56];
  string local_3b0 [60];
  int local_374;
  string local_358 [36];
  uint local_334;
  string local_330 [39];
  allocator local_309;
  string local_308 [124];
  int local_28c;
  double local_288 [4];
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1d8 [4];
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  char *local_100;
  char *local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined4 local_c4;
  char *local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  char *local_a0;
  char *local_98;
  undefined8 local_90;
  undefined4 local_84;
  char *local_80;
  char *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  double local_48;
  double local_40;
  double *local_38;
  double *local_30;
  double local_28;
  double local_20;
  double *local_18;
  double *local_10;
  double *local_8;
  
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4e86dc);
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
            ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4e86e9);
  for (local_28c = 0; local_28c < 0x15; local_28c = local_28c + 1) {
    local_1d8[local_28c] = 0.0;
    local_288[local_28c] = 0.0;
    pbVar4 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff5d0,(size_type)in_stack_fffffffffffff5c8);
    iVar2 = std::__cxx11::string::compare((char *)pbVar4);
    if (iVar2 == 0) {
      local_288[local_28c] = 0.233;
    }
    pbVar4 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff5d0,(size_type)in_stack_fffffffffffff5c8);
    iVar2 = std::__cxx11::string::compare((char *)pbVar4);
    if (iVar2 == 0) {
      local_288[local_28c] = 0.767;
    }
    pbVar4 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff5d0,(size_type)in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff674 = std::__cxx11::string::compare((string *)pbVar4);
    if (in_stack_fffffffffffff674 == 0) {
      local_1d8[local_28c] = 1.0;
    }
  }
  pele::physics::PelePhysics<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport>::
  eos<>();
  name = &local_309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"peleLM",name);
  amrex::ParmParse::ParmParse(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::string(local_330);
  bVar1 = amrex::ParmParse::contains(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  iVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff664);
  local_334 = (uint)bVar1;
  if (local_334 != 0) {
    amrex::ParmParse::query
              ((ParmParse *)CONCAT44(iVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658,
               (string *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
               (int)((ulong)in_stack_fffffffffffff648 >> 0x20));
    iVar3 = std::__cxx11::string::compare((char *)local_330);
    if (iVar3 == 0) {
      psVar11 = local_358;
      std::__cxx11::string::string(psVar11);
      amrex::ParmParse::query
                ((ParmParse *)CONCAT44(iVar2,in_stack_fffffffffffff660),(char *)psVar11,
                 (string *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 (int)((ulong)in_stack_fffffffffffff648 >> 0x20));
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x4e896a);
      iVar3 = amrex::ParmParse::countval
                        ((ParmParse *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                         (char *)name,iVar2);
      local_374 = iVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
      amrex::ParmParse::getarr
                ((ParmParse *)CONCAT44(iVar3,in_stack_fffffffffffff650),in_stack_fffffffffffff648,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (int)((ulong)in_stack_fffffffffffff638 >> 0x20),(int)in_stack_fffffffffffff638);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      std::__cxx11::string::string(local_3b0,local_358);
      parseComposition(in_stack_fffffffffffff818,in_stack_fffffffffffff810,in_stack_fffffffffffff808
                      );
      std::__cxx11::string::~string(local_3b0);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x4e8a40);
      iVar2 = amrex::ParmParse::countval
                        ((ParmParse *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                         (char *)name,iVar2);
      local_374 = iVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
      amrex::ParmParse::getarr
                ((ParmParse *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffff648,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                 (int)((ulong)in_stack_fffffffffffff638 >> 0x20),(int)in_stack_fffffffffffff638);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      std::__cxx11::string::string(local_3e8,local_358);
      parseComposition(in_stack_fffffffffffff818,in_stack_fffffffffffff810,in_stack_fffffffffffff808
                      );
      std::__cxx11::string::~string(local_3e8);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x4e8b16);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x4e8b23);
      std::__cxx11::string::~string(local_358);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_330);
      if (iVar3 == 0) {
        psVar11 = local_408;
        std::__cxx11::string::string(psVar11);
        amrex::ParmParse::query
                  ((ParmParse *)CONCAT44(iVar2,in_stack_fffffffffffff660),in_stack_fffffffffffff658,
                   (string *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                   (int)((ulong)psVar11 >> 0x20));
        iVar3 = std::__cxx11::string::compare((char *)local_408);
        if (iVar3 == 0) {
          in_stack_fffffffffffff644 =
               amrex::ParmParse::countval
                         ((ParmParse *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670)
                          ,(char *)name,iVar2);
          local_40c = in_stack_fffffffffffff644;
          if (in_stack_fffffffffffff644 != 0x15) {
            local_78 = "entryCount==NUM_SPECIES";
            local_80 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
            ;
            local_84 = 0x525;
            local_90 = 0;
            amrex::Assert_host(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                               in_stack_fffffffffffff7f4,in_stack_fffffffffffff7e8);
          }
          puVar10 = local_429;
          std::allocator<double>::allocator((allocator<double> *)0x4e8d88);
          amrex::Vector<double,_std::allocator<double>_>::vector
                    ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5d0,
                     (size_type)in_stack_fffffffffffff5c8,(allocator_type *)0x4e8d9f);
          std::allocator<double>::~allocator((allocator<double> *)0x4e8dae);
          amrex::ParmParse::getarr
                    ((ParmParse *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                     (char *)psVar11,
                     (vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     (int)((ulong)puVar10 >> 0x20),(int)puVar10);
          for (local_430 = 0; local_430 < 0x15; local_430 = local_430 + 1) {
            pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5d0
                                ,(size_type)in_stack_fffffffffffff5c8);
            local_288[local_430] = *pdVar5;
          }
          in_stack_fffffffffffff634 =
               amrex::ParmParse::countval
                         ((ParmParse *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670)
                          ,(char *)name,iVar2);
          local_40c = in_stack_fffffffffffff634;
          if (in_stack_fffffffffffff634 != 0x15) {
            local_98 = "entryCount==NUM_SPECIES";
            local_a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
            ;
            local_a4 = 0x52c;
            local_b0 = 0;
            amrex::Assert_host(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                               in_stack_fffffffffffff7f4,in_stack_fffffffffffff7e8);
          }
          amrex::ParmParse::getarr
                    ((ParmParse *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                     (char *)psVar11,
                     (vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     (int)((ulong)puVar10 >> 0x20),(int)puVar10);
          for (local_434 = 0; local_434 < 0x15; local_434 = local_434 + 1) {
            pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5d0
                                ,(size_type)in_stack_fffffffffffff5c8);
            local_1d8[local_434] = *pdVar5;
          }
          amrex::Vector<double,_std::allocator<double>_>::~Vector
                    ((Vector<double,_std::allocator<double>_> *)0x4e8fa9);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_408);
          if (iVar3 == 0) {
            in_stack_fffffffffffff630 =
                 amrex::ParmParse::countval
                           ((ParmParse *)
                            CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                            (char *)name,iVar2);
            local_59c = in_stack_fffffffffffff630;
            if (in_stack_fffffffffffff630 != 0x15) {
              local_b8 = "entryCount==NUM_SPECIES";
              local_c0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
              ;
              local_c4 = 0x534;
              local_d0 = 0;
              amrex::Assert_host(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                                 in_stack_fffffffffffff7f4,in_stack_fffffffffffff7e8);
            }
            std::allocator<double>::allocator((allocator<double> *)0x4e9072);
            amrex::Vector<double,_std::allocator<double>_>::vector
                      ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff5d0,
                       (size_type)in_stack_fffffffffffff5c8,(allocator_type *)0x4e9089);
            std::allocator<double>::~allocator((allocator<double> *)0x4e9098);
            amrex::ParmParse::getarr
                      ((ParmParse *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                       (char *)psVar11,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                       (int)((ulong)in_stack_fffffffffffff638 >> 0x20),
                       (int)in_stack_fffffffffffff638);
            for (local_5c0 = 0; local_5c0 < 0x15; local_5c0 = local_5c0 + 1) {
              pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                                 ((Vector<double,_std::allocator<double>_> *)
                                  in_stack_fffffffffffff5d0,(size_type)in_stack_fffffffffffff5c8);
              local_598[local_5c0] = *pdVar5;
            }
            local_59c = amrex::ParmParse::countval
                                  ((ParmParse *)
                                   CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                                   (char *)name,iVar2);
            if (local_59c != 0x15) {
              local_d8 = "entryCount==NUM_SPECIES";
              local_e0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
              ;
              local_e4 = 0x53b;
              local_f0 = 0;
              amrex::Assert_host(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                                 in_stack_fffffffffffff7f4,in_stack_fffffffffffff7e8);
            }
            amrex::ParmParse::getarr
                      ((ParmParse *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                       (char *)psVar11,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                       (int)((ulong)in_stack_fffffffffffff638 >> 0x20),
                       (int)in_stack_fffffffffffff638);
            for (local_5c4 = 0; local_5c4 < 0x15; local_5c4 = local_5c4 + 1) {
              pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                                 ((Vector<double,_std::allocator<double>_> *)
                                  in_stack_fffffffffffff5d0,(size_type)in_stack_fffffffffffff5c8);
              local_4e8[local_5c4] = *pdVar5;
            }
            local_58 = local_598;
            local_60 = local_288;
            local_40 = local_4f8 * 39.95 +
                       local_500 * 28.014 +
                       local_508 * 30.07 +
                       local_510 * 29.062 +
                       local_518 * 28.054 +
                       local_520 * 31.034 +
                       local_528 * 30.026 +
                       local_530 * 29.018 +
                       local_538 * 44.009 +
                       local_540 * 28.01 +
                       local_548 * 16.043 +
                       local_550 * 15.035 +
                       local_558 * 14.027 +
                       local_560 * 14.027 +
                       local_568 * 33.006 +
                       local_570 * 18.015 +
                       local_578 * 17.007 +
                       local_598[3] * 31.998 +
                       local_598[2] * 15.999 + local_598[1] * 1.008 + local_598[0] * 2.016 + 0.0;
            local_48 = 1.0 / local_40;
            local_288[0] = local_598[0] * 2.016 * local_48;
            local_288[1] = local_598[1] * 1.008 * local_48;
            local_288[2] = local_598[2] * 15.999 * local_48;
            local_288[3] = local_598[3] * 31.998 * local_48;
            local_268 = local_578 * 17.007 * local_48;
            local_260 = local_570 * 18.015 * local_48;
            local_258 = local_568 * 33.006 * local_48;
            local_250 = local_560 * 14.027 * local_48;
            local_248 = local_558 * 14.027 * local_48;
            local_240 = local_550 * 15.035 * local_48;
            local_238 = local_548 * 16.043 * local_48;
            local_230 = local_540 * 28.01 * local_48;
            local_228 = local_538 * 44.009 * local_48;
            local_220 = local_530 * 29.018 * local_48;
            local_218 = local_528 * 30.026 * local_48;
            local_210 = local_520 * 31.034 * local_48;
            local_208 = local_518 * 28.054 * local_48;
            local_200 = local_510 * 29.062 * local_48;
            local_1f8 = local_508 * 30.07 * local_48;
            local_1f0 = local_500 * 28.014 * local_48;
            local_1e8 = local_4f8 * 39.95 * local_48;
            local_68 = local_4e8;
            local_70 = local_1d8;
            local_20 = local_448 * 39.95 +
                       local_450 * 28.014 +
                       local_458 * 30.07 +
                       local_460 * 29.062 +
                       local_468 * 28.054 +
                       local_470 * 31.034 +
                       local_478 * 30.026 +
                       local_480 * 29.018 +
                       local_488 * 44.009 +
                       local_490 * 28.01 +
                       local_498 * 16.043 +
                       local_4a0 * 15.035 +
                       local_4a8 * 14.027 +
                       local_4b0 * 14.027 +
                       local_4b8 * 33.006 +
                       local_4c0 * 18.015 +
                       local_4c8 * 17.007 +
                       local_4e8[3] * 31.998 +
                       local_4e8[2] * 15.999 + local_4e8[1] * 1.008 + local_4e8[0] * 2.016 + 0.0;
            local_28 = 1.0 / local_20;
            local_1d8[0] = local_4e8[0] * 2.016 * local_28;
            local_1d8[1] = local_4e8[1] * 1.008 * local_28;
            local_1d8[2] = local_4e8[2] * 15.999 * local_28;
            local_1d8[3] = local_4e8[3] * 31.998 * local_28;
            local_1b8 = local_4c8 * 17.007 * local_28;
            local_1b0 = local_4c0 * 18.015 * local_28;
            local_1a8 = local_4b8 * 33.006 * local_28;
            local_1a0 = local_4b0 * 14.027 * local_28;
            local_198 = local_4a8 * 14.027 * local_28;
            local_190 = local_4a0 * 15.035 * local_28;
            local_188 = local_498 * 16.043 * local_28;
            local_180 = local_490 * 28.01 * local_28;
            local_178 = local_488 * 44.009 * local_28;
            local_170 = local_480 * 29.018 * local_28;
            local_168 = local_478 * 30.026 * local_28;
            local_160 = local_470 * 31.034 * local_28;
            local_158 = local_468 * 28.054 * local_28;
            local_150 = local_460 * 29.062 * local_28;
            local_148 = local_458 * 30.07 * local_28;
            local_140 = local_450 * 28.014 * local_28;
            local_138 = local_448 * 39.95 * local_28;
            local_38 = local_60;
            local_30 = local_58;
            local_18 = local_70;
            local_10 = local_68;
            amrex::Vector<double,_std::allocator<double>_>::~Vector
                      ((Vector<double,_std::allocator<double>_> *)0x4ea25e);
          }
          else {
            local_f8 = "Unknown mixtureFraction.type ! Should be \'mass\' or \'mole\'";
            amrex::Abort_host((char *)in_stack_fffffffffffff5e0);
          }
        }
        std::__cxx11::string::~string(local_408);
      }
      else {
        local_100 = "Unknown mixtureFraction.format ! Should be \'Cantera\' or \'RealList\'";
        amrex::Abort_host((char *)in_stack_fffffffffffff5e0);
      }
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if (((uVar6 & 1) != 0) && (local_334 == 0)) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char (*) [82])in_stack_fffffffffffff5c8);
    amrex::Print::~Print((Print *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  }
  local_778[2] = 0.0;
  local_778[3] = 0.0;
  local_778[0] = 0.0;
  local_778[1] = 0.0;
  pele::physics::eos::atomic_weightsCHON<pele::physics::eos::Fuego>
            ((Real *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
  if ((local_778[0] != 0.0) || (NAN(local_778[0]))) {
    local_9f0 = 2.0 / local_778[0];
  }
  else {
    local_9f0 = 0.0;
  }
  pvVar7 = std::array<double,_4UL>::operator[]
                     ((array<double,_4UL> *)in_stack_fffffffffffff5d0,
                      (size_type)in_stack_fffffffffffff5c8);
  *pvVar7 = local_9f0;
  if ((local_778[1] != 0.0) || (NAN(local_778[1]))) {
    dVar9 = 1.0 / (local_778[1] * 2.0);
  }
  else {
    dVar9 = 0.0;
  }
  pvVar7 = std::array<double,_4UL>::operator[]
                     ((array<double,_4UL> *)in_stack_fffffffffffff5d0,
                      (size_type)in_stack_fffffffffffff5c8);
  *pvVar7 = dVar9;
  if ((local_778[2] != 0.0) || (NAN(local_778[2]))) {
    dVar9 = -1.0 / local_778[2];
  }
  else {
    dVar9 = 0.0;
  }
  pvVar7 = std::array<double,_4UL>::operator[]
                     ((array<double,_4UL> *)in_stack_fffffffffffff5d0,
                      (size_type)in_stack_fffffffffffff5c8);
  *pvVar7 = dVar9;
  pvVar7 = std::array<double,_4UL>::operator[]
                     ((array<double,_4UL> *)in_stack_fffffffffffff5d0,
                      (size_type)in_stack_fffffffffffff5c8);
  *pvVar7 = 0.0;
  pele::physics::eos::element_compositionCHON<pele::physics::eos::Fuego>(in_stack_fffffffffffff7d0);
  local_50 = local_978;
  local_978[0] = 2.016;
  local_978[1] = 1.008;
  local_978[2] = 15.999;
  local_978[3] = 31.998;
  local_978[4] = 17.007;
  local_978[5] = 18.015;
  local_978[6] = 33.006;
  local_978[7] = 14.027;
  local_978[8] = 14.027;
  local_978[9] = 15.035;
  local_978[10] = 16.043;
  Zfu = 0.0;
  Zox = 0.0;
  local_8 = local_50;
  for (local_97c = 0; local_97c < 0x15; local_97c = local_97c + 1) {
    pvVar8 = std::array<double,_21UL>::operator[]
                       ((array<double,_21UL> *)in_stack_fffffffffffff5d0,
                        (size_type)in_stack_fffffffffffff5c8);
    *pvVar8 = 0.0;
    for (local_980 = 0; local_980 < 4; local_980 = local_980 + 1) {
      pvVar7 = std::array<double,_4UL>::operator[]
                         ((array<double,_4UL> *)in_stack_fffffffffffff5d0,
                          (size_type)in_stack_fffffffffffff5c8);
      in_stack_fffffffffffff5d0 = (Print *)*pvVar7;
      dVar9 = ((double)local_8c8[local_97c * 4 + local_980] * local_778[local_980]) /
              local_978[local_97c];
      pvVar8 = std::array<double,_21UL>::operator[]
                         ((array<double,_21UL> *)in_stack_fffffffffffff5d0,
                          (size_type)in_stack_fffffffffffff5c8);
      *pvVar8 = (double)in_stack_fffffffffffff5d0 * dVar9 + *pvVar8;
    }
    pvVar8 = std::array<double,_21UL>::operator[]
                       ((array<double,_21UL> *)in_stack_fffffffffffff5d0,
                        (size_type)in_stack_fffffffffffff5c8);
    Zfu = *pvVar8 * local_1d8[local_97c] + Zfu;
    pvVar8 = std::array<double,_21UL>::operator[]
                       ((array<double,_21UL> *)in_stack_fffffffffffff5d0,
                        (size_type)in_stack_fffffffffffff5c8);
    Zox = *pvVar8 * local_288[local_97c] + Zox;
  }
  mixture_fraction_ready = true;
  std::__cxx11::string::~string(local_330);
  amrex::ParmParse::~ParmParse((ParmParse *)0x4ea877);
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4ea884);
  return;
}

Assistant:

void
PeleLM::init_mixture_fraction()
{
      // Get default fuel and oxy tank composition
      Vector<std::string> specNames;
      pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
      amrex::Real YF[NUM_SPECIES], YO[NUM_SPECIES];
      for (int i=0; i<NUM_SPECIES; ++i) {
         YF[i] = 0.0;
         YO[i] = 0.0;
         if (!specNames[i].compare("O2"))  YO[i] = 0.233;
         if (!specNames[i].compare("N2"))  YO[i] = 0.767;
         if (!specNames[i].compare(fuelName)) YF[i] = 1.0;
      }

      auto eos = pele::physics::PhysicsType::eos();
      // Overwrite with user-defined value if provided in input file
      ParmParse pp("peleLM");
      std::string MFformat;
      int hasUserMF = pp.contains("mixtureFraction.format");
      if ( hasUserMF ) {
         pp.query("mixtureFraction.format", MFformat);
         if ( !MFformat.compare("Cantera")) {             // use a Cantera-like format with <SpeciesName>:<Value>, default in 0.0
            std::string MFCompoType;
            pp.query("mixtureFraction.type", MFCompoType);
            Vector<std::string> compositionIn;
            int entryCount = pp.countval("mixtureFraction.oxidTank");
            compositionIn.resize(entryCount);
            pp.getarr("mixtureFraction.oxidTank",compositionIn,0,entryCount);
            parseComposition(compositionIn, MFCompoType, YO);
            entryCount = pp.countval("mixtureFraction.fuelTank");
            compositionIn.resize(entryCount);
            pp.getarr("mixtureFraction.fuelTank",compositionIn,0,entryCount);
            parseComposition(compositionIn, MFCompoType, YF);
         } else if ( !MFformat.compare("RealList")) {     // use a list of Real. MUST contains an entry for each species in the mixture
            std::string MFCompoType;
            pp.query("mixtureFraction.type", MFCompoType);
            if ( !MFCompoType.compare("mass") ) {
               int entryCount = pp.countval("mixtureFraction.oxidTank");
               AMREX_ALWAYS_ASSERT(entryCount==NUM_SPECIES);
               Vector<amrex::Real> compositionIn(NUM_SPECIES);
               pp.getarr("mixtureFraction.oxidTank",compositionIn,0,NUM_SPECIES);
               for (int i=0; i<NUM_SPECIES; ++i) {
                  YO[i] = compositionIn[i];
               }
               entryCount = pp.countval("mixtureFraction.fuelTank");
               AMREX_ALWAYS_ASSERT(entryCount==NUM_SPECIES);
               pp.getarr("mixtureFraction.fuelTank",compositionIn,0,NUM_SPECIES);
               for (int i=0; i<NUM_SPECIES; ++i) {
                  YF[i] = compositionIn[i];
               }
            } else if ( !MFCompoType.compare("mole") ) {
               amrex::Real XF[NUM_SPECIES], XO[NUM_SPECIES];
               int entryCount = pp.countval("mixtureFraction.oxidTank");
               AMREX_ALWAYS_ASSERT(entryCount==NUM_SPECIES);
               Vector<amrex::Real> compositionIn(NUM_SPECIES);
               pp.getarr("mixtureFraction.oxidTank",compositionIn,0,NUM_SPECIES);
               for (int i=0; i<NUM_SPECIES; ++i) {
                  XO[i] = compositionIn[i];
               }
               entryCount = pp.countval("mixtureFraction.fuelTank");
               AMREX_ALWAYS_ASSERT(entryCount==NUM_SPECIES);
               pp.getarr("mixtureFraction.fuelTank",compositionIn,0,NUM_SPECIES);
               for (int i=0; i<NUM_SPECIES; ++i) {
                  XF[i] = compositionIn[i];
               }

               eos.X2Y(XO,YO);
               eos.X2Y(XF,YF);
            } else {
               Abort("Unknown mixtureFraction.type ! Should be 'mass' or 'mole'");
            }
         } else {
            Abort("Unknown mixtureFraction.format ! Should be 'Cantera' or 'RealList'");
         }
      }
      if (fuelName.empty() && !hasUserMF) {
          Print() << " Mixture fraction definition lacks fuelName: consider using ns.fuelName keyword \n";
      }

      // Only interested in CHON -in that order. Compute Bilger weights
      amrex::Real atwCHON[4] = {0.0};
      pele::physics::eos::atomic_weightsCHON<pele::physics::PhysicsType::eos_type>(atwCHON);
      Beta_mix[0] = ( atwCHON[0] != 0.0 ) ? 2.0/atwCHON[0] : 0.0;
      Beta_mix[1] = ( atwCHON[1] != 0.0 ) ? 1.0/(2.0*atwCHON[1]) : 0.0;
      Beta_mix[2] = ( atwCHON[2] != 0.0 ) ? -1.0/atwCHON[2] : 0.0;
      Beta_mix[3] = 0.0;

      // Compute each species weight for the Bilger formulation based on elemental compo
      // Only interested in CHON -in that order.
      int ecompCHON[NUM_SPECIES*4];
      pele::physics::eos::element_compositionCHON<pele::physics::PhysicsType::eos_type>(ecompCHON);
      amrex::Real mwt[NUM_SPECIES];
      eos.molecular_weight(mwt);
      Zfu = 0.0;
      Zox = 0.0;
      for (int i=0; i<NUM_SPECIES; ++i) {
         spec_Bilger_fact[i] = 0.0;
         for (int k = 0; k < 4; k++) {
            spec_Bilger_fact[i] += Beta_mix[k] * (ecompCHON[i*4 + k]*atwCHON[k]/mwt[i]);
         }
         Zfu += spec_Bilger_fact[i]*YF[i];
         Zox += spec_Bilger_fact[i]*YO[i];
      }

      mixture_fraction_ready = true;
}